

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O0

void * cgltf_calloc(cgltf_options *options,size_t element_size,cgltf_size count)

{
  undefined1 auVar1 [16];
  void *result;
  cgltf_size count_local;
  size_t element_size_local;
  cgltf_options *options_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = element_size;
  if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar1,0) < count) {
    options_local = (cgltf_options *)0x0;
  }
  else {
    options_local =
         (cgltf_options *)
         (*(options->memory).alloc)((options->memory).user_data,element_size * count);
    if (options_local == (cgltf_options *)0x0) {
      options_local = (cgltf_options *)0x0;
    }
    else {
      memset(options_local,0,element_size * count);
    }
  }
  return options_local;
}

Assistant:

static void* cgltf_calloc(cgltf_options* options, size_t element_size, cgltf_size count)
{
	if (SIZE_MAX / element_size < count)
	{
		return NULL;
	}
	void* result = options->memory.alloc(options->memory.user_data, element_size * count);
	if (!result)
	{
		return NULL;
	}
	memset(result, 0, element_size * count);
	return result;
}